

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

void Llb_CoreSetVarMaps(Llb_Img_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  Aig_Man_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  int *__s_00;
  Vec_Int_t *pVVar11;
  int *__s_01;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint local_5c;
  int *local_58;
  
  pVVar3 = p->vVarsCs;
  if (pVVar3 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsCs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x245,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  pVVar4 = p->vVarsNs;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarsNs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x246,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vCs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x247,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNs2Glo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x248,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Cs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x249,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGlo2Ns == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                  ,0x24a,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
  }
  pAVar5 = p->pAig;
  iVar14 = pAVar5->vObjs->nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar13 = iVar14 - 1;
  iVar7 = 0x10;
  if (0xe < uVar13) {
    iVar7 = iVar14;
  }
  pVVar8->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = iVar14;
LAB_0082a7e5:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
    pVVar8->pArray = __s;
    pVVar8->nSize = iVar14;
    if (__s == (int *)0x0) goto LAB_0082a7e5;
    memset(__s,0xff,(long)iVar14 << 2);
    iVar14 = pAVar5->vObjs->nSize;
    uVar13 = iVar14 - 1;
  }
  p->vCs2Glo = pVVar8;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < uVar13) {
    iVar7 = iVar14;
  }
  pVVar9->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = iVar14;
LAB_0082a85b:
    local_58 = (int *)0x0;
  }
  else {
    local_58 = (int *)malloc((long)iVar7 << 2);
    pVVar9->pArray = local_58;
    pVVar9->nSize = iVar14;
    if (local_58 == (int *)0x0) goto LAB_0082a85b;
    memset(local_58,0xff,(long)iVar14 << 2);
  }
  p->vNs2Glo = pVVar9;
  iVar14 = pAVar5->nRegs;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  local_5c = iVar14 - 1;
  iVar7 = 0x10;
  if (0xe < local_5c) {
    iVar7 = iVar14;
  }
  pVVar10->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = iVar14;
LAB_0082a8eb:
    __s_00 = (int *)0x0;
  }
  else {
    __s_00 = (int *)malloc((long)iVar7 << 2);
    pVVar10->pArray = __s_00;
    pVVar10->nSize = iVar14;
    if (__s_00 == (int *)0x0) goto LAB_0082a8eb;
    memset(__s_00,0xff,(long)iVar14 << 2);
    iVar14 = pAVar5->nRegs;
    local_5c = iVar14 - 1;
  }
  p->vGlo2Cs = pVVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < local_5c) {
    iVar7 = iVar14;
  }
  pVVar11->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar11->pArray = (int *)0x0;
    pVVar11->nSize = iVar14;
  }
  else {
    __s_01 = (int *)malloc((long)iVar7 << 2);
    pVVar11->pArray = __s_01;
    pVVar11->nSize = iVar14;
    if (__s_01 != (int *)0x0) {
      memset(__s_01,0xff,(long)iVar14 << 2);
      iVar14 = pAVar5->nRegs;
      goto LAB_0082a967;
    }
  }
  __s_01 = (int *)0x0;
LAB_0082a967:
  p->vGlo2Ns = pVVar11;
  if (0 < iVar14) {
    lVar12 = 0;
    do {
      if ((pVVar3->nSize <= lVar12) || (pVVar4->nSize <= lVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar13 = pVVar3->pArray[lVar12];
      if (((int)uVar13 < 0) || (uVar1 = pAVar5->vObjs->nSize, (int)uVar1 <= (int)uVar13)) {
        __assert_fail("iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                      ,0x253,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
      }
      uVar2 = pVVar4->pArray[lVar12];
      if (((int)uVar2 < 0) || (uVar1 <= uVar2)) {
        __assert_fail("iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Core.c"
                      ,0x254,"void Llb_CoreSetVarMaps(Llb_Img_t *)");
      }
      if (pVVar8->nSize <= (int)uVar13) goto LAB_0082aa7a;
      __s[uVar13] = (int)lVar12;
      if (((pVVar9->nSize <= (int)uVar2) ||
          (local_58[uVar2] = (int)lVar12, pVVar10->nSize <= lVar12)) ||
         (__s_00[lVar12] = uVar13, pVVar11->nSize <= lVar12)) goto LAB_0082aa7a;
      __s_01[lVar12] = uVar2;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar5->nRegs);
  }
  if (0 < pAVar5->nTruePis) {
    pVVar6 = pAVar5->vCis;
    lVar12 = 0;
    do {
      if (pVVar6->nSize <= lVar12) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar14 = *(int *)((long)pVVar6->pArray[lVar12] + 0x24);
      if (((long)iVar14 < 0) || (pVVar8->nSize <= iVar14)) {
LAB_0082aa7a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar14] = pAVar5->nRegs + (int)lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAVar5->nTruePis);
  }
  return;
}

Assistant:

void Llb_CoreSetVarMaps( Llb_Img_t * p )
{
    Aig_Obj_t * pObj;
    int i, iVarCs, iVarNs;
    assert( p->vVarsCs != NULL );
    assert( p->vVarsNs != NULL );
    assert( p->vCs2Glo == NULL );
    assert( p->vNs2Glo == NULL );
    assert( p->vGlo2Cs == NULL );
    assert( p->vGlo2Ns == NULL );
    p->vCs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vNs2Glo = Vec_IntStartFull( Aig_ManObjNumMax(p->pAig) );
    p->vGlo2Cs = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    p->vGlo2Ns = Vec_IntStartFull( Aig_ManRegNum(p->pAig) );
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        iVarCs = Vec_IntEntry( p->vVarsCs, i );
        iVarNs = Vec_IntEntry( p->vVarsNs, i );
        assert( iVarCs >= 0 && iVarCs < Aig_ManObjNumMax(p->pAig) );
        assert( iVarNs >= 0 && iVarNs < Aig_ManObjNumMax(p->pAig) );
        Vec_IntWriteEntry( p->vCs2Glo, iVarCs, i );
        Vec_IntWriteEntry( p->vNs2Glo, iVarNs, i );
        Vec_IntWriteEntry( p->vGlo2Cs, i, iVarCs );
        Vec_IntWriteEntry( p->vGlo2Ns, i, iVarNs );
    }
    // add mapping of the PIs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Vec_IntWriteEntry( p->vCs2Glo, Aig_ObjId(pObj), Aig_ManRegNum(p->pAig)+i );
}